

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

void pfx_table_notify_diff_cb(pfx_record *record,void *data)

{
  long lVar1;
  int iVar2;
  code *pcVar3;
  undefined1 uVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(rtr_socket **)((long)data + 0x10) == record->socket) {
    if (*(char *)((long)data + 0x20) == '\x01') {
      iVar2 = pfx_table_remove(*data,record);
      if (iVar2 != 0) {
        lVar5 = *(long *)((long)data + 8);
        pcVar3 = *(code **)(lVar5 + 0x10);
        if (pcVar3 != (code *)0x0) {
          uVar4 = *(undefined1 *)((long)data + 0x20);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
LAB_00108934:
            (*pcVar3)(lVar5,uVar4);
            return;
          }
          goto LAB_0010893b;
        }
      }
    }
    else if ((*(rtr_socket **)((long)data + 0x10) == record->socket) &&
            (*(char *)((long)data + 0x20) == '\0')) {
      lVar5 = *(long *)((long)data + 8);
      pcVar3 = *(code **)(lVar5 + 0x10);
      if (pcVar3 != (code *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar4 = 0;
          goto LAB_00108934;
        }
        goto LAB_0010893b;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0010893b:
  __stack_chk_fail();
}

Assistant:

static void pfx_table_notify_diff_cb(const struct pfx_record *record, void *data)
{
	struct notify_diff_cb_args *args = data;

	if (args->socket == record->socket && args->added) {
		if (pfx_table_remove(args->old_table, record) != PFX_SUCCESS)
			pfx_table_notify_clients(args->new_table, record, args->added);
	} else if (args->socket == record->socket && !args->added) {
		pfx_table_notify_clients(args->new_table, record, args->added);
	}
}